

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool tinygltf::ParseNumberProperty
               (double *ret,string *err,json *o,string *property,bool required,string *parent_node)

{
  bool bVar1;
  ulong uVar2;
  string *in_RSI;
  undefined8 *in_RDI;
  byte in_R8B;
  bool isNumber;
  double numberValue;
  json_const_iterator it;
  json *in_stack_fffffffffffffec8;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffed0;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_118 [32];
  string local_f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  json *in_stack_ffffffffffffff20;
  undefined8 local_d0;
  string local_c8 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78 [79];
  byte local_29;
  string *local_18;
  undefined8 *local_10;
  bool local_1;
  
  local_29 = in_R8B & 1;
  local_18 = in_RSI;
  local_10 = in_RDI;
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::iter_impl(in_stack_fffffffffffffed0);
  std::__cxx11::string::c_str();
  bVar1 = anon_unknown_58::FindMember
                    (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                     (json_const_iterator *)in_stack_ffffffffffffff10);
  if (bVar1) {
    anon_unknown_58::GetValue((json_const_iterator *)0x16f828);
    bVar1 = anon_unknown_58::GetNumber(in_stack_fffffffffffffec8,(double *)0x16f835);
    if (bVar1) {
      if (local_10 != (undefined8 *)0x0) {
        *local_10 = local_d0;
      }
      local_1 = true;
    }
    else {
      if (((local_29 & 1) != 0) && (local_18 != (string *)0x0)) {
        std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
        std::operator+(in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0);
        std::__cxx11::string::operator+=(local_18,local_f8);
        std::__cxx11::string::~string(local_f8);
        std::__cxx11::string::~string(local_118);
      }
      local_1 = false;
    }
  }
  else {
    if (((local_29 & 1) != 0) && (local_18 != (string *)0x0)) {
      __lhs = &local_98;
      std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      std::operator+(__lhs,(char *)in_stack_fffffffffffffed0);
      std::__cxx11::string::operator+=(local_18,local_78);
      std::__cxx11::string::~string(local_78);
      std::__cxx11::string::~string((string *)&local_98);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        psVar3 = local_c8;
        std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
        std::__cxx11::string::operator+=(local_18,psVar3);
        std::__cxx11::string::~string(local_c8);
      }
      std::__cxx11::string::operator+=(local_18,".\n");
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool ParseNumberProperty(double *ret, std::string *err, const json &o,
                                const std::string &property,
                                const bool required,
                                const std::string &parent_node = "") {
  json_const_iterator it;

  if (!FindMember(o, property.c_str(), it)) {
    if (required) {
      if (err) {
        (*err) += "'" + property + "' property is missing";
        if (!parent_node.empty()) {
          (*err) += " in " + parent_node;
        }
        (*err) += ".\n";
      }
    }
    return false;
  }

  double numberValue;
  bool isNumber = GetNumber(GetValue(it), numberValue);

  if (!isNumber) {
    if (required) {
      if (err) {
        (*err) += "'" + property + "' property is not a number type.\n";
      }
    }
    return false;
  }

  if (ret) {
    (*ret) = numberValue;
  }

  return true;
}